

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::CustomLayerParams_CustomLayerParamValue::clear_value
          (CustomLayerParams_CustomLayerParamValue *this)

{
  ValueCase VVar1;
  string *default_value;
  CustomLayerParams_CustomLayerParamValue *this_local;
  
  VVar1 = value_case(this);
  switch(VVar1) {
  case VALUE_NOT_SET:
    break;
  case kDoubleValue:
    break;
  case kStringValue:
    default_value = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    google::protobuf::internal::ArenaStringPtr::DestroyNoArena
              (&(this->value_).stringvalue_,default_value);
    break;
  case kIntValue:
    break;
  case kLongValue:
    break;
  case kBoolValue:
  }
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void CustomLayerParams_CustomLayerParamValue::clear_value() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.CustomLayerParams.CustomLayerParamValue)
  switch (value_case()) {
    case kDoubleValue: {
      // No need to clear
      break;
    }
    case kStringValue: {
      value_.stringvalue_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
      break;
    }
    case kIntValue: {
      // No need to clear
      break;
    }
    case kLongValue: {
      // No need to clear
      break;
    }
    case kBoolValue: {
      // No need to clear
      break;
    }
    case VALUE_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = VALUE_NOT_SET;
}